

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Group.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Grouping_Switch(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var8;
  string *psVar9;
  uint uVar10;
  ulong uVar11;
  string use;
  string def;
  string an;
  int32_t local_9c;
  allocator<char> local_95;
  uint local_94;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar6 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if ((int)uVar6 < 1) {
    local_9c = -1;
  }
  else {
    uVar11 = 0;
    local_9c = -1;
    local_94 = uVar6;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar7 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)CONCAT44(extraout_var,iVar7),&local_95);
      iVar7 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar7 == 0) {
        iVar7 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar7);
        psVar9 = &local_70;
LAB_005bcaef:
        pcVar3 = (char *)psVar9->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar9,0,pcVar3,(ulong)__s);
        uVar6 = local_94;
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar7 == 0) {
          iVar7 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar7);
          psVar9 = &local_90;
          goto LAB_005bcaef;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if (((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)&local_50), iVar7 != 0))
           && (iVar7 = std::__cxx11::string::compare((char *)&local_50), iVar7 != 0)) {
          iVar7 = std::__cxx11::string::compare((char *)&local_50);
          if (iVar7 == 0) {
            local_9c = XML_ReadNode_GetAttrVal_AsI32(this,(int)uVar11);
          }
          else {
            Throw_IncorrectAttr(this,&local_50);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar10 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar6 != uVar10);
  }
  if (local_90._M_string_length == 0) {
    ParseHelper_Group_Begin(this,false);
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&this->NodeElement_Cur->ID);
    }
    *(undefined1 *)
     ((long)&this->NodeElement_Cur[1].Child.
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev + 1) = 1;
    *(int32_t *)
     ((long)&this->NodeElement_Cur[1].Child.
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_prev + 4) = local_9c;
    iVar7 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((char)iVar7 != '\0') {
      ParseHelper_Node_Exit(this);
    }
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar5 = FindNodeElement(this,&local_90,ENET_Group,(CX3DImporter_NodeElement **)&local_50);
    if (!bVar5) {
      Throw_USE_NotFound(this,&local_90);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)local_50._M_dataplus._M_p;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar4->Child).
              super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Grouping_Switch()
{
    std::string def, use;
    int32_t whichChoice = -1;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("whichChoice", whichChoice, XML_ReadNode_GetAttrVal_AsI32);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		CX3DImporter_NodeElement* ne;

		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Group, ne);
	}
	else
	{
		ParseHelper_Group_Begin();// create new grouping element and go deeper if node has children.
		// at this place new group mode created and made current, so we can name it.
		if(!def.empty()) NodeElement_Cur->ID = def;

		// also set values specific to this type of group
		((CX3DImporter_NodeElement_Group*)NodeElement_Cur)->UseChoice = true;
		((CX3DImporter_NodeElement_Group*)NodeElement_Cur)->Choice = whichChoice;
		// in grouping set of nodes check X3DMetadataObject is not needed, because it is done in <Scene> parser function.

		// for empty element exit from node in that place
		if(mReader->isEmptyElement()) ParseHelper_Node_Exit();
	}// if(!use.empty()) else
}